

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool anon_unknown.dwarf_59ef72::la_diagnostic(archive *ar,la_ssize_t r)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  char *pcVar4;
  char local_1a [2];
  
  bVar3 = true;
  if (r < 0) {
    pcVar1 = archive_error_string(ar);
    if ((ulong)r < 0xffffffffffffffec) {
      pcVar4 = "unknown error";
      if (pcVar1 != (char *)0x0) {
        pcVar4 = pcVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"cmake -E tar: error: ",0x15);
      sVar2 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar2);
      local_1a[1] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1a + 1,1);
      bVar3 = false;
    }
    else {
      pcVar4 = "unknown warning";
      if (pcVar1 != (char *)0x0) {
        pcVar4 = pcVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"cmake -E tar: warning: ",0x17);
      sVar2 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar2);
      local_1a[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1a,1);
    }
  }
  return bVar3;
}

Assistant:

bool la_diagnostic(struct archive* ar, __LA_SSIZE_T r)
{
  // See archive.h definition of ARCHIVE_OK for return values.

  if (r >= ARCHIVE_OK) {
    return true;
  }

  if (r >= ARCHIVE_WARN) {
    const char* warn = archive_error_string(ar);
    if (!warn) {
      warn = "unknown warning";
    }
    std::cerr << "cmake -E tar: warning: " << warn << '\n';
    return true;
  }

  // Error.
  const char* err = archive_error_string(ar);
  if (!err) {
    err = "unknown error";
  }
  std::cerr << "cmake -E tar: error: " << err << '\n';
  return false;
}